

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void CheckInputAttributes(TidyDocImpl *doc,Node *node)

{
  bool bVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  TidyAttrId TVar5;
  AttVal *pAVar6;
  ctmbstr cp;
  char *pcVar7;
  
  pAVar6 = node->attributes;
  if (pAVar6 != (AttVal *)0x0) {
    bVar1 = false;
    bVar2 = false;
    do {
      if (pAVar6->dict != (Attribute *)0x0) {
        TVar5 = pAVar6->dict->id;
        if (TVar5 == TidyAttr_TYPE) {
          pcVar7 = pAVar6->value;
          if (pcVar7 != (char *)0x0) {
            do {
              if (*pcVar7 == '\0') goto LAB_00154fab;
              BVar3 = prvTidyIsWhite((int)*pcVar7);
              pcVar7 = pcVar7 + 1;
            } while (BVar3 != no);
            if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (pAVar6->value != (ctmbstr)0x0)) {
              iVar4 = prvTidytmbstrcasecmp(pAVar6->value,"image");
              if (iVar4 == 0) {
                bVar1 = true;
              }
            }
          }
LAB_00154fab:
          if (pAVar6->dict == (Attribute *)0x0) goto LAB_00154fe0;
          TVar5 = pAVar6->dict->id;
        }
        if ((TVar5 == TidyAttr_ALT) && (pcVar7 = pAVar6->value, pcVar7 != (char *)0x0)) {
          do {
            if (*pcVar7 == '\0') goto LAB_00154fe0;
            BVar3 = prvTidyIsWhite((int)*pcVar7);
            pcVar7 = pcVar7 + 1;
          } while (BVar3 != no);
          bVar2 = true;
        }
      }
LAB_00154fe0:
      pAVar6 = pAVar6->next;
    } while (pAVar6 != (AttVal *)0x0);
    if (!bVar2 && bVar1) {
      prvTidyReportAccessError(doc,node,0x29c);
      return;
    }
  }
  return;
}

Assistant:

static void CheckInputAttributes( TidyDocImpl* doc, Node* node )
{
    Bool HasAlt = no;
    Bool MustHaveAlt = no;
    AttVal* av;

    /* Checks attributes within the INPUT element */
    for (av = node->attributes; av != NULL; av = av->next)
    {
        /* 'VALUE' must be found if the 'TYPE' is 'text' or 'checkbox' */
        if ( attrIsTYPE(av) && hasValue(av) )
        {
            if (Level1_Enabled( doc ))
            {
                if (AttrValueIs(av, "image"))
                {
                    MustHaveAlt = yes;
                }
            }

        }

        if ( attrIsALT(av) && hasValue(av) )
        {
            HasAlt = yes;
        }
    }

    if ( MustHaveAlt && !HasAlt )
    {
        TY_(ReportAccessError)( doc, node, IMG_BUTTON_MISSING_ALT );
    }

}